

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenTypeFileInput.cpp
# Opt level: O0

EStatusCode __thiscall OpenTypeFileInput::ReadHMtx(OpenTypeFileInput *this)

{
  undefined1 auVar1 [16];
  bool bVar2;
  Trace *this_00;
  pointer ppVar3;
  ulong uVar4;
  HMtxTable pHVar5;
  uint local_34;
  iterator iStack_30;
  uint i;
  unsigned_long local_28;
  _Self local_20;
  iterator it;
  OpenTypeFileInput *this_local;
  
  it._M_node = (_Base_ptr)this;
  local_28 = GetTag(this,"hmtx");
  local_20._M_node =
       (_Base_ptr)
       std::
       map<unsigned_long,_TableEntry,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_TableEntry>_>_>
       ::find(&this->mTables,&local_28);
  iStack_30 = std::
              map<unsigned_long,_TableEntry,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_TableEntry>_>_>
              ::end(&this->mTables);
  bVar2 = std::operator==(&local_20,&stack0xffffffffffffffd0);
  if (bVar2) {
    this_00 = Trace::DefaultTrace();
    Trace::TraceToLog(this_00,"OpenTypeFileInput::ReadHMtx, could not find hmtx table");
    this_local._4_4_ = eFailure;
  }
  else {
    ppVar3 = std::_Rb_tree_iterator<std::pair<const_unsigned_long,_TableEntry>_>::operator->
                       (&local_20);
    OpenTypePrimitiveReader::SetOffset(&this->mPrimitivesReader,(ppVar3->second).Offset);
    auVar1 = ZEXT216((this->mMaxp).NumGlyphs) * ZEXT816(4);
    uVar4 = auVar1._0_8_;
    if (auVar1._8_8_ != 0) {
      uVar4 = 0xffffffffffffffff;
    }
    pHVar5 = (HMtxTable)operator_new__(uVar4);
    this->mHMtx = pHVar5;
    for (local_34 = 0; local_34 < (this->mHHea).NumberOfHMetrics; local_34 = local_34 + 1) {
      OpenTypePrimitiveReader::ReadUSHORT
                (&this->mPrimitivesReader,&this->mHMtx[local_34].AdvanceWidth);
      OpenTypePrimitiveReader::ReadSHORT
                (&this->mPrimitivesReader,&this->mHMtx[local_34].LeftSideBearing);
    }
    for (; local_34 < (this->mMaxp).NumGlyphs; local_34 = local_34 + 1) {
      this->mHMtx[local_34].AdvanceWidth =
           this->mHMtx[(int)((this->mHHea).NumberOfHMetrics - 1)].AdvanceWidth;
      OpenTypePrimitiveReader::ReadSHORT
                (&this->mPrimitivesReader,&this->mHMtx[local_34].LeftSideBearing);
    }
    this_local._4_4_ = OpenTypePrimitiveReader::GetInternalState(&this->mPrimitivesReader);
  }
  return this_local._4_4_;
}

Assistant:

EStatusCode OpenTypeFileInput::ReadHMtx()
{
	ULongToTableEntryMap::iterator it = mTables.find(GetTag("hmtx"));
	if(it == mTables.end())
	{
		TRACE_LOG("OpenTypeFileInput::ReadHMtx, could not find hmtx table");
		return PDFHummus::eFailure;
	}

	mPrimitivesReader.SetOffset(it->second.Offset);

	mHMtx = new HMtxTableEntry[mMaxp.NumGlyphs];

	unsigned int i=0;

	for(; i < mHHea.NumberOfHMetrics;++i)
	{
		mPrimitivesReader.ReadUSHORT(mHMtx[i].AdvanceWidth);
		mPrimitivesReader.ReadSHORT(mHMtx[i].LeftSideBearing);
	}

	for(; i < mMaxp.NumGlyphs; ++i)
	{
		mHMtx[i].AdvanceWidth = mHMtx[mHHea.NumberOfHMetrics-1].AdvanceWidth;
		mPrimitivesReader.ReadSHORT(mHMtx[i].LeftSideBearing);
	}

	return mPrimitivesReader.GetInternalState();	
}